

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnGenericCustomSection
          (BinaryReaderIR *this,string_view name,void *data,Offset size)

{
  Custom custom;
  Custom local_c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  Location local_50;
  
  GetLocation(&local_50,this);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Custom::Custom(&local_c0,&local_50,name,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c0.data,size);
  if (size != 0) {
    memcpy(local_c0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,data,size);
  }
  std::vector<wabt::Custom,_std::allocator<wabt::Custom>_>::emplace_back<wabt::Custom>
            (&this->module_->customs,&local_c0);
  Custom::~Custom(&local_c0);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnGenericCustomSection(std::string_view name,
                                              const void* data,
                                              Offset size) {
  Custom custom = Custom(GetLocation(), name);
  custom.data.resize(size);
  if (size > 0) {
    memcpy(custom.data.data(), data, size);
  }
  module_->customs.push_back(std::move(custom));
  return Result::Ok;
}